

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::
ContainerEqMatcher<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
::
MatchAndExplain<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
          (ContainerEqMatcher<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
           *this,vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                 *lhs,MatchResultListener *listener)

{
  pointer peVar1;
  ostream *os;
  bool bVar2;
  long lVar3;
  bool bVar4;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  it_1;
  external_fixup *peVar5;
  external_fixup *peVar6;
  char *pcVar7;
  pointer peVar8;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  it;
  external_fixup *peVar9;
  external_fixup *peVar10;
  char *local_38;
  
  peVar8 = (lhs->
           super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
           )._M_impl.super__Vector_impl_data._M_start;
  peVar1 = (lhs->
           super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  peVar10 = *(external_fixup **)this;
  if ((long)peVar1 - (long)peVar8 == *(long *)(this + 8) - (long)peVar10) {
    bVar4 = true;
    for (; peVar8 != peVar1; peVar8 = peVar8 + 1) {
      bVar2 = pstore::repo::external_fixup::operator==(peVar8,peVar10);
      if (!bVar2) goto LAB_001711c8;
      peVar10 = peVar10 + 1;
    }
  }
  else {
LAB_001711c8:
    os = listener->stream_;
    if (os != (ostream *)0x0) {
      peVar8 = (lhs->
               super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (peVar8 == (lhs->
                    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        local_38 = "which";
      }
      else {
        bVar4 = false;
        do {
          peVar10 = *(external_fixup **)this;
          peVar5 = *(external_fixup **)(this + 8);
          if (peVar10 == peVar5) {
LAB_0017121c:
            if (bVar4) {
              std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        (os,"which has these unexpected elements: ",0x25);
              bVar4 = true;
            }
            pstore::repo::operator<<(os,peVar8);
          }
          else {
            do {
              bVar2 = pstore::repo::external_fixup::operator==(peVar10,peVar8);
              peVar9 = peVar10;
              if (bVar2) break;
              peVar10 = peVar10 + 1;
              peVar9 = peVar5;
            } while (peVar10 != peVar5);
            if (peVar9 == *(external_fixup **)(this + 8)) goto LAB_0017121c;
          }
          peVar8 = peVar8 + 1;
        } while (peVar8 != (lhs->
                           super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
        local_38 = "which";
        if (bVar4) {
          local_38 = ",\nand";
        }
      }
      peVar10 = *(external_fixup **)this;
      if (peVar10 != *(external_fixup **)(this + 8)) {
        bVar4 = false;
        do {
          peVar5 = (lhs->
                   super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          peVar9 = (lhs->
                   super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (peVar5 == peVar9) {
LAB_001712dc:
            if (bVar4) {
              lVar3 = 2;
              pcVar7 = ", ";
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>(os,local_38,5);
              lVar3 = 0x27;
              pcVar7 = " doesn\'t have these expected elements: ";
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,lVar3);
            pstore::repo::operator<<(os,peVar10);
            bVar4 = true;
          }
          else {
            do {
              bVar2 = pstore::repo::external_fixup::operator==(peVar5,peVar10);
              peVar6 = peVar5;
              if (bVar2) break;
              peVar5 = peVar5 + 1;
              peVar6 = peVar9;
            } while (peVar5 != peVar9);
            if (peVar6 == (lhs->
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          )._M_impl.super__Vector_impl_data._M_finish) goto LAB_001712dc;
          }
          peVar10 = peVar10 + 1;
        } while (peVar10 != *(external_fixup **)(this + 8));
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }